

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O1

void __thiscall CDBWrapper::CDBWrapper(CDBWrapper *this,DBParams *params)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value;
  ulong uVar1;
  LevelDBContext *pLVar2;
  pointer pcVar3;
  DB *pDVar4;
  pointer puVar5;
  string_view source_file;
  bool bVar6;
  value_type *__val;
  _Head_base<0UL,_LevelDBContext_*,_false> __s;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar7;
  Logger *pLVar8;
  Env *pEVar9;
  long lVar10;
  pointer *__ptr;
  undefined8 *puVar11;
  Options *pOVar12;
  char *pcVar13;
  long in_FS_OFFSET;
  byte bVar14;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  Span<unsigned_char> bytes;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view str;
  string_view logging_function_06;
  undefined1 auVar15 [16];
  Options options;
  Status status;
  vector<unsigned_char,_std::allocator<unsigned_char>_> new_key;
  string log_msg;
  char *in_stack_fffffffffffffe60;
  Elf64_Ehdr *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int local_170 [2];
  undefined1 local_168 [8];
  undefined8 uStack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _List local_148;
  int local_140 [2];
  Cache *local_138;
  CompressionType local_118;
  FilterPolicy *local_110;
  path local_100 [2];
  DB local_98 [4];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s._M_head_impl = (LevelDBContext *)operator_new(0x98);
  memset(__s._M_head_impl,0,0x98);
  leveldb::Options::Options(&(__s._M_head_impl)->options);
  ((__s._M_head_impl)->readoptions).verify_checksums = false;
  ((__s._M_head_impl)->readoptions).fill_cache = true;
  ((__s._M_head_impl)->readoptions).snapshot = (Snapshot *)0x0;
  ((__s._M_head_impl)->iteroptions).verify_checksums = false;
  ((__s._M_head_impl)->iteroptions).fill_cache = true;
  ((__s._M_head_impl)->iteroptions).snapshot = (Snapshot *)0x0;
  (__s._M_head_impl)->writeoptions = false;
  (__s._M_head_impl)->syncoptions = false;
  (this->m_db_context)._M_t.
  super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
  super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl = __s._M_head_impl;
  auVar15 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar15._8_8_ == 0 ||
      auVar15._0_8_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::filesystem::__cxx11::path::path(local_100);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_58,auVar15._0_8_,0,auVar15._8_8_);
    std::filesystem::__cxx11::path::path(local_100,&local_58,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  std::filesystem::__cxx11::path::path((path *)local_168,local_100);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_name,local_168,(char *)((long)local_168 + (long)uStack_160));
  std::filesystem::__cxx11::path::~path((path *)local_168);
  std::filesystem::__cxx11::path::~path(local_100);
  value = &this->obfuscate_key;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::filesystem::__cxx11::path::path(&(this->m_path).super_path,(path *)params);
  this->m_is_memory = params->memory_only;
  puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  ((puVar7->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
   super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
   super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->penv = (Env *)0x0;
  puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar7->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->readoptions).verify_checksums =
       true;
  puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar7->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->iteroptions).verify_checksums =
       true;
  puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar7->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->iteroptions).fill_cache = false;
  pcVar13 = "m_db_context";
  puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar7->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->syncoptions).sync = true;
  uVar1 = params->cache_bytes;
  leveldb::Options::Options((Options *)local_168);
  local_138 = leveldb::NewLRUCache(uVar1 >> 1);
  local_148._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(uVar1 >> 2);
  local_110 = leveldb::NewBloomFilterPolicy(10);
  local_118 = kNoCompression;
  local_158._8_8_ = operator_new(8);
  *(undefined ***)local_158._8_8_ = &PTR__Logger_00b3a818;
  uStack_160._0_3_ = CONCAT12(true,(undefined2)uStack_160);
  local_170[0] = local_140[0];
  pLVar8 = LogInstance();
  bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar8,LEVELDB,Debug);
  if (bVar6) {
    pLVar8 = LogInstance();
    bVar6 = BCLog::Logger::Enabled(pLVar8);
    if (bVar6) {
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      tinyformat::format<int,int>
                (&local_78,(tinyformat *)"LevelDB using max_open_files=%d (default=%d)\n",
                 (char *)local_140,local_170,(int *)pcVar13);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        (ulong)(local_78.field_2._M_allocated_capacity + 1));
      }
      pLVar8 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x56;
      local_78._M_string_length = 0x853a53;
      in_stack_fffffffffffffe60 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      in_stack_fffffffffffffe70 = 1;
      in_stack_fffffffffffffe68 = &tinyformat::detail::formatImpl;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file._M_len = 0x56;
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      logging_function_06._M_str = "SetMaxOpenFiles";
      logging_function_06._M_len = 0xf;
      BCLog::Logger::LogPrintStr(pLVar8,str,logging_function_06,source_file,0x86,LEVELDB,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  puVar11 = (undefined8 *)local_168;
  pOVar12 = &((puVar7->_M_t).
              super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
              super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
              super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options;
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    pOVar12->comparator = (Comparator *)*puVar11;
    puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
    pOVar12 = (Options *)((long)pOVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar7->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).create_if_missing = true;
  if (params->memory_only == true) {
    pEVar9 = leveldb::Env::Default();
    pEVar9 = leveldb::NewMemEnv(pEVar9);
    puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    ((puVar7->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t
     .super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
     super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->penv = pEVar9;
    puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    pEVar9 = ((puVar7->_M_t).
              super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
              super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
              super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->penv;
    puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    (((puVar7->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>.
      _M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
      super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).env = pEVar9;
  }
  else {
    if (params->wipe_data == true) {
      pcVar3 = (params->path).super_path._M_pathname._M_dataplus._M_p;
      local_168 = (undefined1  [8])&local_158;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,pcVar3,
                 pcVar3 + (params->path).super_path._M_pathname._M_string_length);
      logging_function._M_str = "CDBWrapper";
      logging_function._M_len = 10;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file_00._M_len = 0x56;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file_00,0xec,
                 IPC|COINDB|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|RPC|ZMQ|HTTP|TOR,
                 (Level)(string *)local_168,in_stack_fffffffffffffe60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe68);
      if (local_168 != (undefined1  [8])&local_158) {
        operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
      }
      pcVar3 = (params->path).super_path._M_pathname._M_dataplus._M_p;
      local_168 = (undefined1  [8])&local_158;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,pcVar3,
                 pcVar3 + (params->path).super_path._M_pathname._M_string_length);
      puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                         (&this->m_db_context,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                          ,0xd3,"DBContext","m_db_context");
      leveldb::DestroyDB((leveldb *)&local_58,(string *)local_168,
                         &((puVar7->_M_t).
                           super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>
                           .super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options);
      if (local_168 != (undefined1  [8])&local_158) {
        operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
      }
      HandleError((Status *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete__(local_58._M_dataplus._M_p);
      }
    }
    TryCreateDirectories(&params->path);
    pcVar3 = (params->path).super_path._M_pathname._M_dataplus._M_p;
    local_168 = (undefined1  [8])&local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,pcVar3,
               pcVar3 + (params->path).super_path._M_pathname._M_string_length);
    logging_function_00._M_str = "CDBWrapper";
    logging_function_00._M_len = 10;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file_01._M_len = 0x56;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_01,0xf1,
               IPC|COINDB|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|RPC|WALLETDB,
               (Level)(string *)local_168,in_stack_fffffffffffffe60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe68);
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
    }
  }
  puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pLVar2 = (puVar7->_M_t).
           super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
           super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
           super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl;
  pcVar3 = (params->path).super_path._M_pathname._M_dataplus._M_p;
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,pcVar3,
             pcVar3 + (params->path).super_path._M_pathname._M_string_length);
  puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  leveldb::DB::Open(local_98,&pLVar2->options,(string *)local_168,
                    &((puVar7->_M_t).
                      super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>
                      .super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
  }
  HandleError((Status *)local_98);
  pcVar13 = "Opened LevelDB successfully\n";
  logging_function_01._M_str = "CDBWrapper";
  logging_function_01._M_len = 10;
  source_file_02._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
  source_file_02._M_len = 0x56;
  ::LogPrintf_<>(logging_function_01,source_file_02,0xf9,ALL,Info,"Opened LevelDB successfully\n");
  if ((params->options).force_compact == true) {
    pcVar3 = (params->path).super_path._M_pathname._M_dataplus._M_p;
    local_168 = (undefined1  [8])&local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,pcVar3,
               pcVar3 + (params->path).super_path._M_pathname._M_string_length);
    logging_function_02._M_str = "CDBWrapper";
    logging_function_02._M_len = 10;
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file_03._M_len = 0x56;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_02,source_file_03,0xfc,
               IPC|COINDB|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|RPC|WALLETDB|ZMQ|BENCH|MEMPOOL,
               (Level)(string *)local_168,pcVar13,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe68);
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
    }
    puVar7 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    pDVar4 = ((puVar7->_M_t).
              super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
              super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
              super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
    (*pDVar4->_vptr_DB[0xb])(pDVar4,0,0);
    pcVar3 = (params->path).super_path._M_pathname._M_dataplus._M_p;
    local_168 = (undefined1  [8])&local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,pcVar3,
               pcVar3 + (params->path).super_path._M_pathname._M_string_length);
    logging_function_03._M_str = "CDBWrapper";
    logging_function_03._M_len = 10;
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file_04._M_len = 0x56;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_03,source_file_04,0xfe,
               IPC|COINDB|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|ESTIMATEFEE|BENCH|HTTP,
               (Level)(string *)local_168,pcVar13,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe68);
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
    }
  }
  local_168 = (undefined1  [8])0x0;
  uStack_160 = (pointer)0x0;
  local_158._M_allocated_capacity = 0;
  local_168 = (undefined1  [8])operator_new(8);
  uStack_160 = (pointer)((long)local_168 + 8);
  *(char *)((long)local_168 + 0) = '\0';
  *(char *)((long)local_168 + 1) = '\0';
  *(char *)((long)local_168 + 2) = '\0';
  *(char *)((long)local_168 + 3) = '\0';
  *(char *)((long)local_168 + 4) = '\0';
  *(char *)((long)local_168 + 5) = '\0';
  *(char *)((long)local_168 + 6) = '\0';
  *(char *)((long)local_168 + 7) = '\0';
  local_158._M_allocated_capacity = (size_type)uStack_160;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(value,local_168);
  if (local_168 != (undefined1  [8])0x0) {
    operator_delete((void *)local_168,local_158._M_allocated_capacity - (long)local_168);
  }
  bVar6 = Read<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (this,&OBFUSCATE_KEY_KEY_abi_cxx11_,value);
  if ((!bVar6) && (params->obfuscate == true)) {
    bVar6 = IsEmpty(this);
    if (bVar6) {
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0;
      local_78._M_dataplus._M_p = (pointer)operator_new(8);
      local_78._M_string_length = (size_type)((uchar *)local_78._M_dataplus._M_p + 8);
      ((uchar *)local_78._M_dataplus._M_p)[0] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[1] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[2] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[3] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[4] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[5] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[6] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[7] = '\0';
      bytes.m_size = 8;
      bytes.m_data = (uchar *)local_78._M_dataplus._M_p;
      local_78.field_2._M_allocated_capacity = local_78._M_string_length;
      GetRandBytes(bytes);
      Write<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (this,&OBFUSCATE_KEY_KEY_abi_cxx11_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (value,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
      pcVar3 = (params->path).super_path._M_pathname._M_dataplus._M_p;
      local_168 = (undefined1  [8])&local_158;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,pcVar3,
                 pcVar3 + (params->path).super_path._M_pathname._M_string_length);
      puVar5 = (this->obfuscate_key).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      s.m_size = (long)(this->obfuscate_key).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar5;
      s.m_data = puVar5;
      HexStr_abi_cxx11_(&local_58,s);
      logging_function_04._M_str = "CDBWrapper";
      logging_function_04._M_len = 10;
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file_05._M_len = 0x56;
      ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                (logging_function_04,source_file_05,0x10f,
                 IPC|COINDB|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|ESTIMATEFEE|ZMQ|BENCH|HTTP|
                 MEMPOOL,(Level)(string *)local_168,(char *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      if (local_168 != (undefined1  [8])&local_158) {
        operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
      }
      if ((uchar *)local_78._M_dataplus._M_p != (uchar *)0x0) {
        operator_delete(local_78._M_dataplus._M_p,
                        local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
      }
    }
  }
  pcVar3 = (params->path).super_path._M_pathname._M_dataplus._M_p;
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,pcVar3,
             pcVar3 + (params->path).super_path._M_pathname._M_string_length);
  puVar5 = (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  s_00.m_size = (long)(this->obfuscate_key).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar5;
  s_00.m_data = puVar5;
  HexStr_abi_cxx11_(&local_58,s_00);
  logging_function_05._M_str = "CDBWrapper";
  logging_function_05._M_len = 10;
  source_file_06._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
  source_file_06._M_len = 0x56;
  ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
            (logging_function_05,source_file_06,0x112,
             IPC|COINDB|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|ESTIMATEFEE|WALLETDB|ZMQ,
             (Level)(string *)local_168,(char *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  if (local_98[0]._vptr_DB != (_func_int **)0x0) {
    operator_delete__(local_98[0]._vptr_DB);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CDBWrapper::CDBWrapper(const DBParams& params)
    : m_db_context{std::make_unique<LevelDBContext>()}, m_name{fs::PathToString(params.path.stem())}, m_path{params.path}, m_is_memory{params.memory_only}
{
    DBContext().penv = nullptr;
    DBContext().readoptions.verify_checksums = true;
    DBContext().iteroptions.verify_checksums = true;
    DBContext().iteroptions.fill_cache = false;
    DBContext().syncoptions.sync = true;
    DBContext().options = GetOptions(params.cache_bytes);
    DBContext().options.create_if_missing = true;
    if (params.memory_only) {
        DBContext().penv = leveldb::NewMemEnv(leveldb::Env::Default());
        DBContext().options.env = DBContext().penv;
    } else {
        if (params.wipe_data) {
            LogPrintf("Wiping LevelDB in %s\n", fs::PathToString(params.path));
            leveldb::Status result = leveldb::DestroyDB(fs::PathToString(params.path), DBContext().options);
            HandleError(result);
        }
        TryCreateDirectories(params.path);
        LogPrintf("Opening LevelDB in %s\n", fs::PathToString(params.path));
    }
    // PathToString() return value is safe to pass to leveldb open function,
    // because on POSIX leveldb passes the byte string directly to ::open(), and
    // on Windows it converts from UTF-8 to UTF-16 before calling ::CreateFileW
    // (see env_posix.cc and env_windows.cc).
    leveldb::Status status = leveldb::DB::Open(DBContext().options, fs::PathToString(params.path), &DBContext().pdb);
    HandleError(status);
    LogPrintf("Opened LevelDB successfully\n");

    if (params.options.force_compact) {
        LogPrintf("Starting database compaction of %s\n", fs::PathToString(params.path));
        DBContext().pdb->CompactRange(nullptr, nullptr);
        LogPrintf("Finished database compaction of %s\n", fs::PathToString(params.path));
    }

    // The base-case obfuscation key, which is a noop.
    obfuscate_key = std::vector<unsigned char>(OBFUSCATE_KEY_NUM_BYTES, '\000');

    bool key_exists = Read(OBFUSCATE_KEY_KEY, obfuscate_key);

    if (!key_exists && params.obfuscate && IsEmpty()) {
        // Initialize non-degenerate obfuscation if it won't upset
        // existing, non-obfuscated data.
        std::vector<unsigned char> new_key = CreateObfuscateKey();

        // Write `new_key` so we don't obfuscate the key with itself
        Write(OBFUSCATE_KEY_KEY, new_key);
        obfuscate_key = new_key;

        LogPrintf("Wrote new obfuscate key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
    }

    LogPrintf("Using obfuscation key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
}